

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O2

EGLSurface
eglu::createWindowSurface
          (NativeDisplay *nativeDisplay,NativeWindow *window,EGLDisplay display,EGLConfig config,
          EGLAttrib *attribList)

{
  Capability CVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  EGLSurface pvVar5;
  TestError *pTVar6;
  InternalError *this_00;
  Library *egl;
  char *__s;
  allocator<char> local_ba;
  allocator<char> local_b9;
  vector<int,_std::allocator<int>_> legacyAttribs;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_88;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_80;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  platformExts;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  eglu *this;
  
  iVar3 = (*nativeDisplay->_vptr_NativeDisplay[2])();
  this = (eglu *)CONCAT44(extraout_var,iVar3);
  CVar1 = window->m_capabilities;
  if ((CVar1 & (CAPABILITY_CREATE_SURFACE_PLATFORM|CAPABILITY_CREATE_SURFACE_LEGACY)) == 0) {
    this_00 = (InternalError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              (this_00,(char *)0x0,"supportsLegacyCreate || supportsPlatformCreate",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
               ,0x120);
  }
  else {
    if ((CVar1 & CAPABILITY_CREATE_SURFACE_PLATFORM) != 0) {
      getClientExtensions_abi_cxx11_(&platformExts,this,egl);
      local_70._M_current =
           platformExts.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_78._M_current =
           platformExts.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&legacyAttribs,"EGL_EXT_platform_base",&local_b9);
      bVar2 = de::
              contains<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                        (&local_70,&local_78,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &legacyAttribs);
      if (bVar2) {
        local_80._M_current =
             platformExts.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_88._M_current =
             platformExts.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        __s = (char *)(nativeDisplay->m_platformExtension)._M_string_length;
        if (__s != (char *)0x0) {
          __s = (nativeDisplay->m_platformExtension)._M_dataplus._M_p;
        }
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_ba);
        bVar2 = de::
                contains<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                          (&local_80,&local_88,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&legacyAttribs);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&platformExts);
        if (bVar2) {
          toLegacyAttribList(&legacyAttribs,attribList);
          iVar3 = (*window->_vptr_NativeWindow[3])(window);
          pvVar5 = (EGLSurface)
                   (**(code **)(*(long *)this + 0x78))
                             (this,display,config,iVar3,
                              legacyAttribs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
          dVar4 = (**(code **)(*(long *)this + 0xf8))(this);
          checkError(dVar4,"eglCreatePlatformWindowSurfaceEXT()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
                     ,0x12f);
          if (pvVar5 == (EGLSurface)0x0) {
            pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar6,(char *)0x0,"surface != EGL_NO_SURFACE",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
                       ,0x130);
            __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
          goto LAB_00e241b0;
        }
      }
      else {
        std::__cxx11::string::~string((string *)&legacyAttribs);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&platformExts);
      }
    }
    if ((CVar1 & CAPABILITY_CREATE_SURFACE_LEGACY) != 0) {
      toLegacyAttribList(&legacyAttribs,attribList);
      iVar3 = (*window->_vptr_NativeWindow[2])(window);
      pvVar5 = (EGLSurface)
               (**(code **)(*(long *)this + 0x90))
                         (this,display,config,iVar3,
                          legacyAttribs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
      dVar4 = (**(code **)(*(long *)this + 0xf8))(this);
      checkError(dVar4,"eglCreateWindowSurface()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
                 ,0x136);
      if (pvVar5 == (EGLSurface)0x0) {
        pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar6,(char *)0x0,"surface != EGL_NO_SURFACE",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
                   ,0x137);
        __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
LAB_00e241b0:
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&legacyAttribs.super__Vector_base<int,_std::allocator<int>_>);
      return pvVar5;
    }
    this_00 = (InternalError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              (this_00,"No supported way to create EGL window surface",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
               ,0x13a);
  }
  __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

EGLSurface createWindowSurface (NativeDisplay& nativeDisplay, NativeWindow& window, EGLDisplay display, EGLConfig config, const EGLAttrib* attribList)
{
	const Library&	egl							= nativeDisplay.getLibrary();
	const bool		supportsLegacyCreate		= (window.getCapabilities() & NativeWindow::CAPABILITY_CREATE_SURFACE_LEGACY) != 0;
	const bool		supportsPlatformCreate		= (window.getCapabilities() & NativeWindow::CAPABILITY_CREATE_SURFACE_PLATFORM) != 0;
	bool			usePlatformExt				= false;
	EGLSurface		surface						= EGL_NO_SURFACE;

	TCU_CHECK_INTERNAL(supportsLegacyCreate || supportsPlatformCreate);

	if (supportsPlatformCreate)
	{
		const vector<string> platformExts = getClientExtensions(egl);
		usePlatformExt = de::contains(platformExts.begin(), platformExts.end(), string("EGL_EXT_platform_base")) &&
						 de::contains(platformExts.begin(), platformExts.end(), string(nativeDisplay.getPlatformExtensionName()));
	}

	// \todo [2014-03-13 pyry] EGL 1.5 core support
	if (usePlatformExt)
	{
		const vector<EGLint>	legacyAttribs	= toLegacyAttribList(attribList);

		surface = egl.createPlatformWindowSurfaceEXT(display, config, window.getPlatformNative(), &legacyAttribs[0]);
		EGLU_CHECK_MSG(egl, "eglCreatePlatformWindowSurfaceEXT()");
		TCU_CHECK(surface != EGL_NO_SURFACE);
	}
	else if (supportsLegacyCreate)
	{
		const vector<EGLint> legacyAttribs = toLegacyAttribList(attribList);
		surface = egl.createWindowSurface(display, config, window.getLegacyNative(), &legacyAttribs[0]);
		EGLU_CHECK_MSG(egl, "eglCreateWindowSurface()");
		TCU_CHECK(surface != EGL_NO_SURFACE);
	}
	else
		throw tcu::InternalError("No supported way to create EGL window surface", DE_NULL, __FILE__, __LINE__);

	DE_ASSERT(surface != EGL_NO_SURFACE);
	return surface;
}